

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

size_t __thiscall TBSCertificate::SetDataSize(TBSCertificate *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  sVar7 = ContextSpecificHolder<Integer,_(unsigned_char)'\xa0',_(OptionType)1>::EncodedSize
                    (&this->version);
  uVar1 = (this->serialNumber).super_DerBase.cbData;
  lVar11 = 2;
  lVar12 = 2;
  if (((((0x7f < uVar1) && (lVar12 = 3, 0xff < uVar1)) && (lVar12 = 4, 0xffff < uVar1)) &&
      ((lVar12 = 5, 0xffffff < uVar1 && (lVar12 = 6, uVar1 >> 0x20 != 0)))) &&
     (lVar12 = 7, uVar1 >> 0x28 != 0)) {
    lVar12 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  uVar2 = (this->signature).super_DerBase.cbData;
  if (((0x7f < uVar2) && (lVar11 = 3, 0xff < uVar2)) &&
     ((lVar11 = 4, 0xffff < uVar2 &&
      (((lVar11 = 5, 0xffffff < uVar2 && (lVar11 = 6, uVar2 >> 0x20 != 0)) &&
       (lVar11 = 7, uVar2 >> 0x28 != 0)))))) {
    lVar11 = (ulong)(uVar2 >> 0x30 == 0) << 3;
  }
  uVar3 = (this->issuer).rdnSequence.super_DerBase.cbData;
  lVar13 = 2;
  lVar14 = 2;
  if (((0x7f < uVar3) && (lVar14 = 3, 0xff < uVar3)) &&
     (((lVar14 = 4, 0xffff < uVar3 &&
       ((lVar14 = 5, 0xffffff < uVar3 && (lVar14 = 6, uVar3 >> 0x20 != 0)))) &&
      (lVar14 = 7, uVar3 >> 0x28 != 0)))) {
    lVar14 = (ulong)(uVar3 >> 0x30 == 0) << 3;
  }
  uVar4 = (this->validity).super_DerBase.cbData;
  if ((((0x7f < uVar4) && (lVar13 = 3, 0xff < uVar4)) && (lVar13 = 4, 0xffff < uVar4)) &&
     (((lVar13 = 5, 0xffffff < uVar4 && (lVar13 = 6, uVar4 >> 0x20 != 0)) &&
      (lVar13 = 7, uVar4 >> 0x28 != 0)))) {
    lVar13 = (ulong)(uVar4 >> 0x30 == 0) << 3;
  }
  uVar5 = (this->subject).rdnSequence.super_DerBase.cbData;
  lVar16 = 2;
  lVar15 = 2;
  if (((0x7f < uVar5) && (lVar15 = 3, 0xff < uVar5)) &&
     ((lVar15 = 4, 0xffff < uVar5 &&
      (((lVar15 = 5, 0xffffff < uVar5 && (lVar15 = 6, uVar5 >> 0x20 != 0)) &&
       (lVar15 = 7, uVar5 >> 0x28 != 0)))))) {
    lVar15 = (ulong)(uVar5 >> 0x30 == 0) << 3;
  }
  uVar6 = (this->subjectPublicKeyInfo).super_DerBase.cbData;
  if ((((0x7f < uVar6) && (lVar16 = 3, 0xff < uVar6)) &&
      ((lVar16 = 4, 0xffff < uVar6 &&
       ((lVar16 = 5, 0xffffff < uVar6 && (lVar16 = 6, uVar6 >> 0x20 != 0)))))) &&
     (lVar16 = 7, uVar6 >> 0x28 != 0)) {
    lVar16 = (ulong)(uVar6 >> 0x30 == 0) << 3;
  }
  sVar8 = ContextSpecificHolder<BitString,_(unsigned_char)'\x81',_(OptionType)0>::EncodedSize
                    (&this->issuerUniqueID);
  sVar9 = ContextSpecificHolder<BitString,_(unsigned_char)'\x82',_(OptionType)0>::EncodedSize
                    (&this->subjectUniqueID);
  sVar10 = ContextSpecificHolder<Extensions,_(unsigned_char)'\xa3',_(OptionType)1>::EncodedSize
                     (&this->extensions);
  sVar7 = sVar10 + uVar6 + lVar16 + sVar8 + sVar9 +
          uVar4 + lVar13 + uVar5 + lVar15 + lVar11 + uVar3 + lVar14 + lVar12 + uVar2 + uVar1 + sVar7
  ;
  (this->super_DerBase).cbData = sVar7;
  return sVar7;
}

Assistant:

virtual size_t SetDataSize() override
	{
        // To facilitate debugging
        size_t cbVersion = version.EncodedSize();
        size_t cbSerial = serialNumber.EncodedSize();
        size_t cbSignature = signature.EncodedSize();
        size_t cbIssuer = issuer.EncodedSize();
        size_t cbValidity = validity.EncodedSize();
        size_t cbSubject = subject.EncodedSize();
        size_t cbPublicKey = subjectPublicKeyInfo.EncodedSize();
        size_t cbIssuerId = issuerUniqueID.EncodedSize();
        size_t cbSubjectId = subjectUniqueID.EncodedSize();
        size_t cbExtensions = extensions.EncodedSize();

		cbData =
			cbVersion +
			cbSerial +
			cbSignature +
			cbIssuer +
			cbValidity + 
			cbSubject + 
			cbPublicKey +
			cbIssuerId +
			cbSubjectId +
			cbExtensions;

		return cbData;
	}